

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_pubsub_on_fork(void)

{
  fio_ls_embd_s *local_38;
  fio_ls_embd_s *n_2;
  fio_ch_set__ordered_s_ *pos_2;
  fio_ls_embd_s *n_1;
  fio_ch_set__ordered_s_ *pos_1;
  fio_ls_embd_s *n;
  fio_ch_set__ordered_s_ *pos;
  
  fio_postoffice.filters.lock = '\0';
  fio_postoffice.pubsub.lock = '\0';
  fio_postoffice.patterns.lock = '\0';
  fio_postoffice.engines.lock = '\0';
  fio_postoffice.meta.lock = '\0';
  cluster_data.lock = '\0';
  cluster_data.uuid = 0;
  for (n = (fio_ls_embd_s *)fio_postoffice.filters.channels.ordered;
      n != (fio_ls_embd_s *)0x0 &&
      n < fio_postoffice.filters.channels.ordered + fio_postoffice.filters.channels.pos; n = n + 1)
  {
    if (n->prev != (fio_ls_embd_s *)0x0) {
      *(undefined1 *)&n->next[3].next = 0;
      for (pos_1 = (fio_ch_set__ordered_s_ *)n->next[2].prev;
          pos_1 != (fio_ch_set__ordered_s_ *)&n->next[1].next;
          pos_1 = (fio_ch_set__ordered_s_ *)pos_1->obj) {
        *(undefined1 *)&pos_1[4].hash = 0;
      }
    }
  }
  for (n_1 = (fio_ls_embd_s *)fio_postoffice.pubsub.channels.ordered;
      n_1 != (fio_ls_embd_s *)0x0 &&
      n_1 < fio_postoffice.pubsub.channels.ordered + fio_postoffice.pubsub.channels.pos;
      n_1 = n_1 + 1) {
    if (n_1->prev != (fio_ls_embd_s *)0x0) {
      *(undefined1 *)&n_1->next[3].next = 0;
      for (pos_2 = (fio_ch_set__ordered_s_ *)n_1->next[2].prev;
          pos_2 != (fio_ch_set__ordered_s_ *)&n_1->next[1].next;
          pos_2 = (fio_ch_set__ordered_s_ *)pos_2->obj) {
        *(undefined1 *)&pos_2[4].hash = 0;
      }
    }
  }
  for (n_2 = (fio_ls_embd_s *)fio_postoffice.patterns.channels.ordered;
      n_2 != (fio_ls_embd_s *)0x0 &&
      n_2 < fio_postoffice.patterns.channels.ordered + fio_postoffice.patterns.channels.pos;
      n_2 = n_2 + 1) {
    if (n_2->prev != (fio_ls_embd_s *)0x0) {
      *(undefined1 *)&n_2->next[3].next = 0;
      for (local_38 = n_2->next[2].prev; local_38 != (fio_ls_embd_s *)&n_2->next[1].next;
          local_38 = local_38->next) {
        *(undefined1 *)&local_38[4].prev = 0;
      }
    }
  }
  return;
}

Assistant:

static void fio_pubsub_on_fork(void) {
  fio_postoffice.filters.lock = FIO_LOCK_INIT;
  fio_postoffice.pubsub.lock = FIO_LOCK_INIT;
  fio_postoffice.patterns.lock = FIO_LOCK_INIT;
  fio_postoffice.engines.lock = FIO_LOCK_INIT;
  fio_postoffice.meta.lock = FIO_LOCK_INIT;
  cluster_data.lock = FIO_LOCK_INIT;
  cluster_data.uuid = 0;
  FIO_SET_FOR_LOOP(&fio_postoffice.filters.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
  FIO_SET_FOR_LOOP(&fio_postoffice.pubsub.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
  FIO_SET_FOR_LOOP(&fio_postoffice.patterns.channels, pos) {
    if (!pos->hash)
      continue;
    pos->obj->lock = FIO_LOCK_INIT;
    FIO_LS_EMBD_FOR(&pos->obj->subscriptions, n) {
      FIO_LS_EMBD_OBJ(subscription_s, node, n)->lock = FIO_LOCK_INIT;
    }
  }
}